

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_arg.cxx
# Opt level: O0

int Fl::args(int argc,char **argv,int *i,Fl_Args_Handler cb)

{
  int iVar1;
  int local_2c;
  Fl_Args_Handler cb_local;
  int *i_local;
  char **argv_local;
  int argc_local;
  
  arg_called = '\x01';
  *i = 1;
  do {
    if (argc <= *i) {
      return *i;
    }
  } while (((cb != (Fl_Args_Handler)0x0) && (iVar1 = (*cb)(argc,argv,i), iVar1 != 0)) ||
          (iVar1 = arg(argc,argv,i), iVar1 != 0));
  if (return_i == '\0') {
    local_2c = 0;
  }
  else {
    local_2c = *i;
  }
  return local_2c;
}

Assistant:

int Fl::args(int argc, char** argv, int& i, Fl_Args_Handler cb) {
  arg_called = 1;
  i = 1; // skip argv[0]
  while (i < argc) {
    if (cb && cb(argc,argv,i)) continue;
    if (!arg(argc,argv,i)) return return_i ? i : 0;
  }
  return i;
}